

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCDouble.h
# Opt level: O0

HighsCDouble * __thiscall HighsCDouble::operator/=(HighsCDouble *this,double v)

{
  HighsCDouble *in_RDI;
  double in_XMM0_Qa;
  HighsCDouble HVar1;
  HighsCDouble c;
  HighsCDouble d;
  HighsCDouble *this_00;
  undefined1 in_stack_ffffffffffffffb0 [16];
  HighsCDouble *in_stack_ffffffffffffffc0;
  HighsCDouble local_20 [2];
  
  HighsCDouble(local_20,in_RDI->hi / in_XMM0_Qa,in_RDI->lo / in_XMM0_Qa);
  this_00 = in_stack_ffffffffffffffb0._0_8_;
  operator*(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb0._8_8_);
  operator-(this_00,in_RDI);
  HVar1 = operator-(this_00,in_RDI);
  in_RDI->hi = HVar1.hi;
  in_RDI->lo = HVar1.lo;
  return in_RDI;
}

Assistant:

HighsCDouble& operator/=(double v) {
    HighsCDouble d(hi / v, lo / v);
    HighsCDouble c = d * v - (*this);
    c.hi /= v;
    c.lo /= v;
    *this = d - c;
    return *this;
  }